

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_adapt.c
# Opt level: O1

REF_STATUS ref_adapt_surf_to_geom(REF_GRID ref_grid,REF_INT passes)

{
  uint in_EAX;
  uint uVar1;
  int iVar2;
  ulong uVar3;
  REF_BOOL all_done;
  undefined8 uStack_38;
  
  uStack_38 = (ulong)in_EAX;
  uVar1 = ref_migrate_to_balance(ref_grid);
  if (uVar1 == 0) {
    uVar1 = ref_metric_interpolated_curvature(ref_grid);
    if (uVar1 == 0) {
      ref_mpi_stopwatch_stop(ref_grid->mpi,"curvature");
      uVar1 = ref_adapt_tattle_faces(ref_grid);
      if (uVar1 == 0) {
        ref_mpi_stopwatch_stop(ref_grid->mpi,"tattle faces");
        uVar1 = 0;
        if (0 < passes && uStack_38._4_4_ == 0) {
          uVar3 = 1;
          while( true ) {
            iVar2 = (int)uVar3;
            if (ref_grid->mpi->id == 0) {
              printf("\n pass %d of %d with %d ranks\n",uVar3,passes,(ulong)(uint)ref_grid->mpi->n);
            }
            uVar1 = ref_adapt_pass(ref_grid,(REF_BOOL *)((long)&uStack_38 + 4));
            if (uVar1 != 0) break;
            uVar1 = ref_migrate_to_balance(ref_grid);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                     ,0x339,"ref_adapt_surf_to_geom",(ulong)uVar1,"migrate to single part");
              return uVar1;
            }
            uVar1 = ref_grid_pack(ref_grid);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                     ,0x33a,"ref_adapt_surf_to_geom",(ulong)uVar1,"pack");
              return uVar1;
            }
            ref_mpi_stopwatch_stop(ref_grid->mpi,"pack");
            uVar1 = ref_metric_interpolated_curvature(ref_grid);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                     ,0x33d,"ref_adapt_surf_to_geom",(ulong)uVar1,"interp curve");
              return uVar1;
            }
            ref_mpi_stopwatch_stop(ref_grid->mpi,"curvature");
            uVar1 = ref_adapt_tattle_faces(ref_grid);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                     ,0x340,"ref_adapt_surf_to_geom",(ulong)uVar1,"tattle");
              return uVar1;
            }
            ref_mpi_stopwatch_stop(ref_grid->mpi,"tattle faces");
            if (uStack_38._4_4_ != 0) {
              return 0;
            }
            uVar3 = (ulong)(iVar2 + 1);
            if (passes <= iVar2) {
              return 0;
            }
          }
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",
                 0x337,"ref_adapt_surf_to_geom",(ulong)uVar1,"pass");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",
               0x330,"ref_adapt_surf_to_geom",(ulong)uVar1,"tattle");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0x32e
             ,"ref_adapt_surf_to_geom",(ulong)uVar1,"interp curve");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0x32d,
           "ref_adapt_surf_to_geom",(ulong)uVar1,"migrate to single part");
  }
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_adapt_surf_to_geom(REF_GRID ref_grid, REF_INT passes) {
  REF_BOOL all_done = REF_FALSE;
  REF_INT pass;

  RSS(ref_migrate_to_balance(ref_grid), "migrate to single part");
  RSS(ref_metric_interpolated_curvature(ref_grid), "interp curve");
  ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "curvature");
  RSS(ref_adapt_tattle_faces(ref_grid), "tattle");
  ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "tattle faces");

  for (pass = 0; !all_done && pass < passes; pass++) {
    if (ref_grid_once(ref_grid))
      printf("\n pass %d of %d with %d ranks\n", pass + 1, passes,
             ref_mpi_n(ref_grid_mpi(ref_grid)));
    RSS(ref_adapt_pass(ref_grid, &all_done), "pass");

    RSS(ref_migrate_to_balance(ref_grid), "migrate to single part");
    RSS(ref_grid_pack(ref_grid), "pack");
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "pack");

    RSS(ref_metric_interpolated_curvature(ref_grid), "interp curve");
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "curvature");

    RSS(ref_adapt_tattle_faces(ref_grid), "tattle");
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "tattle faces");
  }

  return REF_SUCCESS;
}